

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

cupdlp_int cupdlp_scaleVector(CUPDLPwork *w,cupdlp_float weight,cupdlp_float *x,cupdlp_int n)

{
  ScaleVector(weight,x,n);
  return 0;
}

Assistant:

cupdlp_int cupdlp_scaleVector(CUPDLPwork *w, const cupdlp_float weight,
                              cupdlp_float *x, const cupdlp_int n) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasDscal(w->cublashandle, n, &weight, x, 1));
#else
  CHECK_CUBLAS(cublasSscal(w->cublashandle, n, &weight, x, 1));
#endif
#else
  ScaleVector(weight, x, n);
#endif
  return 0;
}